

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2Imm8S4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  undefined4 local_2c;
  int imm;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  
  if (Val == 0) {
    MCOperand_CreateImm0(Inst,-0x80000000);
  }
  else {
    local_2c = Val & 0xff;
    if ((Val & 0x100) == 0) {
      local_2c = -local_2c;
    }
    MCOperand_CreateImm0(Inst,(long)(int)(local_2c << 2));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeT2Imm8S4(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	if (Val == 0)
		MCOperand_CreateImm0(Inst, INT32_MIN);
	else {
		int imm = Val & 0xFF;

		if (!(Val & 0x100)) imm *= -1;
		MCOperand_CreateImm0(Inst, imm * 4);
	}

	return MCDisassembler_Success;
}